

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

uint __thiscall
ON_3dPointListRef::GetMeshNgonPoints
          (ON_3dPointListRef *this,ON_MeshNgon *mesh_ngon,ON_SimpleArray<ON_3dPoint> *ngon_points)

{
  uint point_index_count;
  uint *point_index_list;
  ON_3dPoint *points;
  ON_SimpleArray<ON_3dPoint> *ngon_points_local;
  ON_MeshNgon *mesh_ngon_local;
  ON_3dPointListRef *this_local;
  
  if (((mesh_ngon == (ON_MeshNgon *)0x0) || (mesh_ngon->m_Vcount == 0)) ||
     (mesh_ngon->m_vi == (uint *)0x0)) {
    ON_SimpleArray<ON_3dPoint>::SetCount(ngon_points,0);
    this_local._4_4_ = 0;
  }
  else {
    ON_SimpleArray<ON_3dPoint>::Reserve(ngon_points,(ulong)mesh_ngon->m_Vcount);
    ON_SimpleArray<ON_3dPoint>::SetCount(ngon_points,mesh_ngon->m_Vcount);
    point_index_count = mesh_ngon->m_Vcount;
    point_index_list = mesh_ngon->m_vi;
    points = ON_SimpleArray<ON_3dPoint>::Array(ngon_points);
    this_local._4_4_ = GetPoints(this,point_index_count,point_index_list,points);
  }
  return this_local._4_4_;
}

Assistant:

unsigned int ON_3dPointListRef::GetMeshNgonPoints(
  const class ON_MeshNgon* mesh_ngon,
  ON_SimpleArray<ON_3dPoint>& ngon_points
  ) const
{
  if ( mesh_ngon && mesh_ngon->m_Vcount > 0 && 0 != mesh_ngon->m_vi )
  {
    ngon_points.Reserve(mesh_ngon->m_Vcount);
    ngon_points.SetCount(mesh_ngon->m_Vcount);
    return GetPoints(mesh_ngon->m_Vcount, mesh_ngon->m_vi, ngon_points.Array());
  }
  ngon_points.SetCount(0);
  return 0;
}